

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBlifMv.c
# Opt level: O2

int Abc_NodeStrashBlifMv(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pObj)

{
  void *pvVar1;
  void *pvVar2;
  Abc_Aig_t *pAVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Abc_Obj_t *pAVar8;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pAVar9;
  Abc_Ntk_t *pAVar10;
  Abc_Ntk_t *pAVar11;
  ulong uVar12;
  char *__format;
  char *pcVar13;
  char *local_78;
  uint local_6c;
  uint local_68;
  uint local_64;
  Abc_Obj_t *local_60;
  Abc_Obj_t *local_58;
  ulong local_50;
  Abc_Obj_t *local_48;
  ulong local_40;
  Abc_Obj_t *local_38;
  
  if ((*(uint *)&pObj->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                  ,0x98,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
  }
  pAVar9 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanouts).pArray];
  local_58 = pObj;
  uVar5 = Abc_ObjMvVarNum(pAVar9);
  local_60 = (Abc_Obj_t *)malloc((long)(int)uVar5 * 8);
  uVar12 = 0;
  local_50 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    local_50 = uVar12;
  }
  for (; pAVar8 = local_58, local_50 != uVar12; uVar12 = uVar12 + 1) {
    pAVar8 = Abc_AigConst1(pNtkNew);
    (&local_60->pNtk)[uVar12] = (Abc_Ntk_t *)((ulong)pAVar8 ^ 1);
  }
  pcVar13 = (char *)(local_58->field_5).pData;
  cVar4 = *pcVar13;
  local_64 = uVar5;
  if ((local_58->vFanins).nSize == 0) {
    if (cVar4 == 'd') {
      cVar4 = 'd';
      while (pcVar13 = pcVar13 + 1, cVar4 != '\n') {
        cVar4 = *pcVar13;
      }
      cVar4 = *pcVar13;
    }
    local_78 = pcVar13;
    if (cVar4 == ' ') {
      local_78 = pcVar13 + 1;
      cVar4 = pcVar13[1];
    }
    iVar6 = 0;
    if (cVar4 != '-') {
      iVar6 = Abc_StringGetNumber(&local_78);
    }
    pAVar8 = local_60;
    if ((int)local_64 <= iVar6) {
      __assert_fail("Index < nValues",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                    ,0xb2,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
    }
    if ((local_64 == 2) && (*local_78 == '-')) {
      pObj_00 = Abc_NtkCreatePi(pNtkNew);
      pAVar8->pNext = pObj_00;
      pAVar8->pNtk = (Abc_Ntk_t *)((ulong)pObj_00 ^ 1);
      pcVar13 = Abc_ObjName(pObj_00);
      Abc_ObjAssignName(pObj_00,"free_var_",pcVar13);
    }
    else {
      pAVar10 = (Abc_Ntk_t *)Abc_AigConst1(pNtkNew);
      (&pAVar8->pNtk)[iVar6] = pAVar10;
    }
    (pAVar9->field_6).pCopy = pAVar8;
  }
  else {
    local_38 = pAVar9;
    if (cVar4 == 'd') {
      local_78 = pcVar13 + 1;
      if (pcVar13[1] == '-') {
        local_78 = pcVar13 + 2;
        local_6c = 0xffffffff;
        local_68 = 0;
      }
      else if (pcVar13[1] == '=') {
        local_78 = pcVar13 + 2;
        local_6c = Abc_StringGetNumber(&local_78);
        if ((pAVar8->vFanins).nSize <= (int)local_6c) {
          __assert_fail("DefIndex < Abc_ObjFaninNum(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                        ,0xcc,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
        }
        local_68 = 0xffffffff;
      }
      else {
        local_68 = Abc_StringGetNumber(&local_78);
        if ((int)local_64 <= (int)local_68) {
          __assert_fail("Def < nValues",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                        ,0xd6,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
        }
        local_6c = 0xffffffff;
      }
      if (*local_78 != '\n') {
        __assert_fail("*pSop == \'\\n\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                      ,0xd8,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
      }
      local_78 = local_78 + 1;
    }
    else {
      local_6c = 0xffffffff;
      local_78 = pcVar13;
      local_68 = local_6c;
    }
    for (; pAVar9 = local_60, uVar5 = local_68, pcVar13 = local_78, *local_78 != '\0';
        local_78 = local_78 + 1) {
      local_48 = Abc_AigConst1(pNtkNew);
      for (uVar12 = 0; pAVar9 = local_58, (long)uVar12 < (long)(pAVar8->vFanins).nSize;
          uVar12 = uVar12 + 1) {
        cVar4 = *pcVar13;
        if (cVar4 == '-') {
          pcVar13 = pcVar13 + 2;
        }
        else {
          pAVar10 = pAVar8->pNtk;
          if (cVar4 == '!') {
            free(local_60);
            pcVar13 = Abc_ObjName((Abc_Obj_t *)pAVar10->vObjs->pArray[*(local_58->vFanouts).pArray])
            ;
            __format = 
            "Abc_NodeStrashBlifMv(): Cannot handle complement in the MV function of node %s.\n";
LAB_006a4a04:
            printf(__format,pcVar13);
            return 0;
          }
          if (cVar4 == '{') {
            free(local_60);
            pcVar13 = Abc_ObjName((Abc_Obj_t *)pAVar10->vObjs->pArray[*(local_58->vFanouts).pArray])
            ;
            __format = 
            "Abc_NodeStrashBlifMv(): Cannot handle braces in the MV function of node %s.\n";
            goto LAB_006a4a04;
          }
          pAVar8 = (Abc_Obj_t *)pAVar10->vObjs->pArray[(local_58->vFanins).pArray[uVar12]];
          local_40 = uVar12;
          iVar6 = Abc_ObjMvVarNum(pAVar8);
          pvVar1 = (pAVar8->field_6).pTemp;
          if (*pcVar13 == '=') {
            local_78 = pcVar13 + 1;
            uVar5 = Abc_StringGetNumber(&local_78);
            if ((pAVar9->vFanins).nSize <= (int)uVar5) {
              __assert_fail("Index < Abc_ObjFaninNum(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                            ,0x10c,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
            }
            if (local_40 == uVar5) {
              __assert_fail("Index != k",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                            ,0x10d,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
            }
            pAVar9 = (Abc_Obj_t *)pAVar9->pNtk->vObjs->pArray[(pAVar9->vFanins).pArray[(int)uVar5]];
            iVar7 = Abc_ObjMvVarNum(pAVar9);
            if (iVar6 != iVar7) {
              __assert_fail("nValuesF == nValuesF2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                            ,0x113,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
            }
            pvVar2 = (pAVar9->field_6).pTemp;
            pAVar9 = Abc_AigConst1(pNtkNew);
            pAVar9 = (Abc_Obj_t *)((ulong)pAVar9 ^ 1);
            for (uVar12 = 0; pAVar8 = local_58, local_50 != uVar12; uVar12 = uVar12 + 1) {
              pAVar3 = (Abc_Aig_t *)pNtkNew->pManFunc;
              pAVar8 = Abc_AigAnd(pAVar3,*(Abc_Obj_t **)((long)pvVar1 + uVar12 * 8),
                                  *(Abc_Obj_t **)((long)pvVar2 + uVar12 * 8));
              pAVar9 = Abc_AigOr(pAVar3,pAVar9,pAVar8);
            }
          }
          else {
            pAVar8 = pAVar9;
            if (*pcVar13 == '(') {
              local_78 = pcVar13 + 1;
              pAVar9 = Abc_AigConst1(pNtkNew);
              pAVar9 = (Abc_Obj_t *)((ulong)pAVar9 ^ 1);
              pcVar13 = pcVar13 + 1;
              while (*pcVar13 != ')') {
                iVar7 = Abc_StringGetNumber(&local_78);
                if (iVar6 <= iVar7) {
                  __assert_fail("Index < nValuesF",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                                ,0xfe,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
                }
                pAVar9 = Abc_AigOr((Abc_Aig_t *)pNtkNew->pManFunc,pAVar9,
                                   *(Abc_Obj_t **)((long)pvVar1 + (long)iVar7 * 8));
                pcVar13 = local_78;
                if (*local_78 != ')') {
                  if (*local_78 != ',') {
                    __assert_fail("*pSop == \')\' || *pSop == \',\'",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                                  ,0x100,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
                  }
                  pcVar13 = local_78 + 1;
                  local_78 = pcVar13;
                }
              }
              local_78 = pcVar13 + 1;
            }
            else {
              iVar7 = Abc_StringGetNumber(&local_78);
              if (iVar6 <= iVar7) {
                __assert_fail("Index < nValuesF",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                              ,0x11b,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
              }
              pAVar9 = *(Abc_Obj_t **)((long)pvVar1 + (long)iVar7 * 8);
            }
          }
          local_48 = Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc,local_48,pAVar9);
          if (*local_78 != ' ') {
            __assert_fail("*pSop == \' \'",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                          ,0x121,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
          }
          pcVar13 = local_78 + 1;
          uVar12 = local_40;
        }
        local_78 = pcVar13;
      }
      if (*pcVar13 == '=') {
        local_78 = pcVar13 + 1;
        iVar6 = Abc_StringGetNumber(&local_78);
        if ((pAVar8->vFanins).nSize <= iVar6) {
          __assert_fail("Index < Abc_ObjFaninNum(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                        ,0x12a,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
        }
        pAVar9 = (Abc_Obj_t *)pAVar8->pNtk->vObjs->pArray[(pAVar8->vFanins).pArray[iVar6]];
        uVar5 = Abc_ObjMvVarNum(pAVar9);
        pAVar8 = local_60;
        if (uVar5 != local_64) {
          __assert_fail("nValuesF == nValues",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                        ,0x12f,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
        }
        pvVar1 = (pAVar9->field_6).pTemp;
        for (uVar12 = 0; local_50 != uVar12; uVar12 = uVar12 + 1) {
          pAVar3 = (Abc_Aig_t *)pNtkNew->pManFunc;
          pAVar10 = (&pAVar8->pNtk)[uVar12];
          pAVar9 = Abc_AigAnd(pAVar3,local_48,*(Abc_Obj_t **)((long)pvVar1 + uVar12 * 8));
          pAVar10 = (Abc_Ntk_t *)Abc_AigOr(pAVar3,(Abc_Obj_t *)pAVar10,pAVar9);
          (&pAVar8->pNtk)[uVar12] = pAVar10;
        }
      }
      else {
        iVar6 = Abc_StringGetNumber(&local_78);
        pAVar9 = local_60;
        if ((int)local_64 <= iVar6) {
          __assert_fail("Index < nValues",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                        ,0x137,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
        }
        pAVar10 = (Abc_Ntk_t *)
                  Abc_AigOr((Abc_Aig_t *)pNtkNew->pManFunc,(Abc_Obj_t *)(&local_60->pNtk)[iVar6],
                            local_48);
        (&pAVar9->pNtk)[iVar6] = pAVar10;
      }
      if (*local_78 != '\n') {
        __assert_fail("*pSop == \'\\n\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                      ,0x13b,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
      }
      pAVar8 = local_58;
    }
    if (-1 < (int)(local_6c & local_68)) {
      pAVar10 = (Abc_Ntk_t *)Abc_AigConst1(pNtkNew);
      for (uVar12 = 0; local_50 != uVar12; uVar12 = uVar12 + 1) {
        if (uVar5 != uVar12) {
          pAVar10 = (Abc_Ntk_t *)
                    Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc,(Abc_Obj_t *)pAVar10,
                               (Abc_Obj_t *)((ulong)(&pAVar9->pNtk)[uVar12] ^ 1));
        }
      }
      if ((int)local_68 < 0) {
        if ((int)local_6c < 0) {
          __assert_fail("DefIndex >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                        ,0x14f,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
        }
        pAVar8 = (Abc_Obj_t *)local_58->pNtk->vObjs->pArray[(local_58->vFanins).pArray[local_6c]];
        uVar5 = Abc_ObjMvVarNum(pAVar8);
        if (uVar5 != local_64) {
          __assert_fail("nValuesF == nValues",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                        ,0x154,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
        }
        pvVar1 = (pAVar8->field_6).pTemp;
        for (uVar12 = 0; local_50 != uVar12; uVar12 = uVar12 + 1) {
          pAVar3 = (Abc_Aig_t *)pNtkNew->pManFunc;
          pAVar11 = (&local_60->pNtk)[uVar12];
          pAVar8 = Abc_AigAnd(pAVar3,(Abc_Obj_t *)pAVar10,*(Abc_Obj_t **)((long)pvVar1 + uVar12 * 8)
                             );
          pAVar9 = local_60;
          pAVar11 = (Abc_Ntk_t *)Abc_AigOr(pAVar3,(Abc_Obj_t *)pAVar11,pAVar8);
          (&pAVar9->pNtk)[uVar12] = pAVar11;
        }
      }
      else {
        (&pAVar9->pNtk)[uVar5] = pAVar10;
      }
    }
    (local_38->field_6).pTemp = pAVar9;
  }
  return 1;
}

Assistant:

int Abc_NodeStrashBlifMv( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pObj )
{
    int fAddFreeVars = 1;
    char * pSop;
    Abc_Obj_t ** pValues, ** pValuesF, ** pValuesF2;
    Abc_Obj_t * pTemp, * pTemp2, * pFanin, * pFanin2, * pNet;
    int k, v, Def, DefIndex, Index, nValues, nValuesF, nValuesF2;

    // start the output values
    assert( Abc_ObjIsNode(pObj) );
    pNet = Abc_ObjFanout0(pObj);
    nValues = Abc_ObjMvVarNum(pNet);
    pValues = ABC_ALLOC( Abc_Obj_t *, nValues );
    for ( k = 0; k < nValues; k++ )
        pValues[k] = Abc_ObjNot( Abc_AigConst1(pNtkNew) );

    // get the BLIF-MV formula
    pSop = (char *)pObj->pData;
    // skip the value line
//    while ( *pSop++ != '\n' );

    // handle the constant
    if ( Abc_ObjFaninNum(pObj) == 0 )
    {
        // skip the default if present
        if ( *pSop == 'd' )
            while ( *pSop++ != '\n' );
        // skip space if present
        if ( *pSop == ' ' )
            pSop++;
        // assume don't-care constant to be zero
        if ( *pSop == '-' )
            Index = 0;
        else
            Index = Abc_StringGetNumber( &pSop );
        assert( Index < nValues );
        ////////////////////////////////////////////
        // adding free variables for binary ND-constants
        if ( fAddFreeVars && nValues == 2 && *pSop == '-' )
        {
            pValues[1] = Abc_NtkCreatePi(pNtkNew);
            pValues[0] = Abc_ObjNot( pValues[1] );
            Abc_ObjAssignName( pValues[1], "free_var_", Abc_ObjName(pValues[1]) );
        }
        else
            pValues[Index] = Abc_AigConst1(pNtkNew);
        ////////////////////////////////////////////
        // save the values in the fanout net
        pNet->pCopy = (Abc_Obj_t *)pValues;
        return 1;
    }

    // parse the default line
    Def = DefIndex = -1;
    if ( *pSop == 'd' )
    {
        pSop++;
        if ( *pSop == '=' )
        {
            pSop++;
            DefIndex = Abc_StringGetNumber( &pSop );
            assert( DefIndex < Abc_ObjFaninNum(pObj) );
        }
        else if ( *pSop == '-' )
        {
            pSop++;
            Def = 0;
        }
        else
        {
            Def = Abc_StringGetNumber( &pSop );
            assert( Def < nValues );
        }
        assert( *pSop == '\n' );
        pSop++;
    }

    // convert the values
    while ( *pSop )
    {
        // extract the values for each cube
        pTemp = Abc_AigConst1(pNtkNew); 
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            if ( *pSop == '-' )
            {
                pSop += 2;
                continue;
            }
            if ( *pSop == '!' )
            {
                ABC_FREE( pValues );
                printf( "Abc_NodeStrashBlifMv(): Cannot handle complement in the MV function of node %s.\n", Abc_ObjName(Abc_ObjFanout0(pObj)) );
                return 0;
            }
            if ( *pSop == '{' )
            {
                ABC_FREE( pValues );
                printf( "Abc_NodeStrashBlifMv(): Cannot handle braces in the MV function of node %s.\n", Abc_ObjName(Abc_ObjFanout0(pObj)) );
                return 0;
            }
            // get the value set
            nValuesF = Abc_ObjMvVarNum(pFanin);
            pValuesF = (Abc_Obj_t **)pFanin->pCopy;
            if ( *pSop == '(' )
            {
                pSop++;
                pTemp2 = Abc_ObjNot( Abc_AigConst1(pNtkNew) );
                while ( *pSop != ')' )
                {
                    Index = Abc_StringGetNumber( &pSop );
                    assert( Index < nValuesF );
                    pTemp2 = Abc_AigOr( (Abc_Aig_t *)pNtkNew->pManFunc, pTemp2, pValuesF[Index] );
                    assert( *pSop == ')' || *pSop == ',' );
                    if ( *pSop == ',' )
                        pSop++;
                }
                assert( *pSop == ')' );
                pSop++;
            }
            else if ( *pSop == '=' )
            {
                pSop++;
                // get the fanin index
                Index = Abc_StringGetNumber( &pSop );
                assert( Index < Abc_ObjFaninNum(pObj) );
                assert( Index != k );
                // get the fanin
                pFanin2 = Abc_ObjFanin( pObj, Index );
                nValuesF2 = Abc_ObjMvVarNum(pFanin2);
                pValuesF2 = (Abc_Obj_t **)pFanin2->pCopy;
                // create the sum of products of values
                assert( nValuesF == nValuesF2 );
                pTemp2 = Abc_ObjNot( Abc_AigConst1(pNtkNew) );
                for ( v = 0; v < nValues; v++ )
                    pTemp2 = Abc_AigOr( (Abc_Aig_t *)pNtkNew->pManFunc, pTemp2, Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc, pValuesF[v], pValuesF2[v]) );
            }
            else
            {
                Index = Abc_StringGetNumber( &pSop );
                assert( Index < nValuesF );
                pTemp2 = pValuesF[Index];
            }
            // compute the compute
            pTemp = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, pTemp, pTemp2 );
            // advance the reading point
            assert( *pSop == ' ' );
            pSop++;
        }
        // check if the output value is an equal construct
        if ( *pSop == '=' )
        {
            pSop++;
            // get the output value
            Index = Abc_StringGetNumber( &pSop );
            assert( Index < Abc_ObjFaninNum(pObj) );
            // add values of the given fanin with the given cube
            pFanin = Abc_ObjFanin( pObj, Index );
            nValuesF = Abc_ObjMvVarNum(pFanin);
            pValuesF = (Abc_Obj_t **)pFanin->pCopy;
            assert( nValuesF == nValues ); // should be guaranteed by the parser
            for ( k = 0; k < nValuesF; k++ )
                pValues[k] = Abc_AigOr( (Abc_Aig_t *)pNtkNew->pManFunc, pValues[k], Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc, pTemp, pValuesF[k]) );
        }
        else
        {
            // get the output value
            Index = Abc_StringGetNumber( &pSop );
            assert( Index < nValues );
            pValues[Index] = Abc_AigOr( (Abc_Aig_t *)pNtkNew->pManFunc, pValues[Index], pTemp );
        }
        // advance the reading point
        assert( *pSop == '\n' );
        pSop++;
    }

    // compute the default value
    if ( Def >= 0 || DefIndex >= 0 )
    {
        pTemp = Abc_AigConst1(pNtkNew);
        for ( k = 0; k < nValues; k++ )
        {
            if ( k == Def )
                continue;
            pTemp = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, pTemp, Abc_ObjNot(pValues[k]) );
        }

        // assign the default value
        if ( Def >= 0 )
            pValues[Def] = pTemp;
        else
        {
            assert( DefIndex >= 0 );
            // add values of the given fanin with the given cube
            pFanin = Abc_ObjFanin( pObj, DefIndex );
            nValuesF = Abc_ObjMvVarNum(pFanin);
            pValuesF = (Abc_Obj_t **)pFanin->pCopy;
            assert( nValuesF == nValues ); // should be guaranteed by the parser
            for ( k = 0; k < nValuesF; k++ )
                pValues[k] = Abc_AigOr( (Abc_Aig_t *)pNtkNew->pManFunc, pValues[k], Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc, pTemp, pValuesF[k]) );
        }

    }

    // save the values in the fanout net
    pNet->pCopy = (Abc_Obj_t *)pValues;
    return 1;
}